

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.cpp
# Opt level: O3

bool duckdb::CSVSchema::CanWeCastIt(LogicalTypeId source,LogicalTypeId destination)

{
  uint uVar1;
  undefined3 in_register_00000031;
  byte bVar2;
  
  bVar2 = 1;
  if (source == destination || CONCAT31(in_register_00000031,destination) == 0x19)
  goto LAB_017df335;
  switch(source) {
  case TINYINT:
    if (destination < CHAR) {
      uVar1 = 0xe07000;
LAB_017df323:
      bVar2 = (byte)(uVar1 >> (destination & UBIGINT));
      goto LAB_017df335;
    }
    break;
  case SMALLINT:
    if (destination < CHAR) {
      uVar1 = 0xe06000;
      goto LAB_017df323;
    }
    break;
  case INTEGER:
    if (destination < CHAR) {
      uVar1 = 0xe04000;
      goto LAB_017df323;
    }
    break;
  case BIGINT:
    bVar2 = (byte)(destination - DECIMAL) < 3;
    goto LAB_017df335;
  case DATE:
  case TIME:
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_NS:
  case DECIMAL:
    break;
  case FLOAT:
    bVar2 = destination == DOUBLE;
    goto LAB_017df335;
  default:
    if (source == SQLNULL) goto LAB_017df335;
  }
  bVar2 = 0;
LAB_017df335:
  return (bool)(bVar2 & 1);
}

Assistant:

bool CSVSchema::CanWeCastIt(LogicalTypeId source, LogicalTypeId destination) {
	if (destination == LogicalTypeId::VARCHAR || source == destination) {
		// We can always cast to varchar
		// And obviously don't have to do anything if they are equal.
		return true;
	}
	switch (source) {
	case LogicalTypeId::SQLNULL:
		return true;
	case LogicalTypeId::TINYINT:
		return destination == LogicalTypeId::SMALLINT || destination == LogicalTypeId::INTEGER ||
		       destination == LogicalTypeId::BIGINT || destination == LogicalTypeId::DECIMAL ||
		       destination == LogicalTypeId::FLOAT || destination == LogicalTypeId::DOUBLE;
	case LogicalTypeId::SMALLINT:
		return destination == LogicalTypeId::INTEGER || destination == LogicalTypeId::BIGINT ||
		       destination == LogicalTypeId::DECIMAL || destination == LogicalTypeId::FLOAT ||
		       destination == LogicalTypeId::DOUBLE;
	case LogicalTypeId::INTEGER:
		return destination == LogicalTypeId::BIGINT || destination == LogicalTypeId::DECIMAL ||
		       destination == LogicalTypeId::FLOAT || destination == LogicalTypeId::DOUBLE;
	case LogicalTypeId::BIGINT:
		return destination == LogicalTypeId::DECIMAL || destination == LogicalTypeId::FLOAT ||
		       destination == LogicalTypeId::DOUBLE;
	case LogicalTypeId::FLOAT:
		return destination == LogicalTypeId::DOUBLE;
	default:
		return false;
	}
}